

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments1.cxx
# Opt level: O3

int testCommandLineArguments1(int argc,char **argv)

{
  char *pcVar1;
  char *__s;
  int iVar2;
  int iVar3;
  long *plVar4;
  size_t sVar5;
  ostream *poVar6;
  uint uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  int newArgc;
  int n;
  char **newArgv;
  char *m;
  string p;
  CommandLineArguments arg;
  int local_98;
  int local_94;
  char **local_90;
  char *local_88;
  string local_80;
  CommandLineArguments local_60;
  
  cmsys::CommandLineArguments::CommandLineArguments(&local_60);
  cmsys::CommandLineArguments::Initialize(&local_60,argc,argv);
  local_94 = 0;
  local_88 = (char *)0x0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  cmsys::CommandLineArguments::AddArgument(&local_60,"-n",SPACE_ARGUMENT,&local_94,"Argument N");
  cmsys::CommandLineArguments::AddArgument(&local_60,"-m",EQUAL_ARGUMENT,&local_88,"Argument M");
  cmsys::CommandLineArguments::AddBooleanArgument(&local_60,"-p",&local_80,"Argument P");
  local_60.StoreUnusedArgumentsFlag = true;
  iVar2 = cmsys::CommandLineArguments::Parse(&local_60);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem parsing arguments",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  uVar7 = (uint)(iVar2 == 0);
  if (local_94 != 0x18) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem setting N. Value of N: ",0x1f);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_94);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    uVar7 = 1;
    std::ostream::flush();
  }
  if (local_88 == (char *)0x0) {
LAB_001210fe:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem setting M. Value of M: ",0x1f);
    pcVar1 = local_88;
    if (local_88 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d450);
    }
    else {
      sVar5 = strlen(local_88);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    uVar7 = 1;
    std::ostream::flush();
  }
  else {
    iVar2 = strcmp(local_88,"test value");
    if (iVar2 != 0) goto LAB_001210fe;
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem setting P. Value of P: ",0x1f);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    uVar7 = 1;
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value of N: ",0xc);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_94);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value of M: ",0xc);
  pcVar1 = local_88;
  if (local_88 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d450);
  }
  else {
    sVar5 = strlen(local_88);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value of P: ",0xc);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_88 != (char *)0x0) {
    operator_delete__(local_88);
  }
  local_90 = (char **)0x0;
  local_98 = 0;
  cmsys::CommandLineArguments::GetUnusedArguments(&local_60,&local_98,&local_90);
  if (local_98 != 9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad number of unused arguments: ",0x20);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_98);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    uVar7 = 1;
    if (local_98 < 1) goto LAB_001215f9;
  }
  puVar8 = &DAT_0014bcd0;
  uVar9 = 0;
  do {
    if (local_90[uVar9] == (char *)0x0) {
      __assert_fail("newArgv[cc]",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/kwsys/testCommandLineArguments1.cxx"
                    ,0x4c,"int testCommandLineArguments1(int, char **)");
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unused argument[",0x10);
    iVar2 = (int)uVar9;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = [",5);
    pcVar1 = local_90[uVar9];
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (uVar9 < 9) {
      if (uVar9 != 0) {
        pcVar1 = (char *)*puVar8;
        iVar3 = strcmp(pcVar1,local_90[uVar9]);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Bad unused argument [",0x15);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] \"",3);
          __s = local_90[uVar9];
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" should be: \"",0xe);
          sVar5 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          goto LAB_001215cd;
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Too many unused arguments: ",0x1b);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
LAB_001215cd:
      std::ostream::put((char)poVar6);
      uVar7 = 1;
      std::ostream::flush();
    }
    uVar9 = uVar9 + 1;
    puVar8 = puVar8 + 1;
  } while ((long)uVar9 < (long)local_98);
LAB_001215f9:
  cmsys::CommandLineArguments::DeleteRemainingArguments(&local_60,local_98,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  cmsys::CommandLineArguments::~CommandLineArguments(&local_60);
  return uVar7;
}

Assistant:

int testCommandLineArguments1(int argc, char* argv[])
{
  kwsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);

  int n = 0;
  char* m = 0;
  std::string p;
  int res = 0;

  typedef kwsys::CommandLineArguments argT;
  arg.AddArgument("-n", argT::SPACE_ARGUMENT, &n, "Argument N");
  arg.AddArgument("-m", argT::EQUAL_ARGUMENT, &m, "Argument M");
  arg.AddBooleanArgument("-p", &p, "Argument P");

  arg.StoreUnusedArguments(true);

  if (!arg.Parse()) {
    std::cerr << "Problem parsing arguments" << std::endl;
    res = 1;
  }
  if (n != 24) {
    std::cout << "Problem setting N. Value of N: " << n << std::endl;
    res = 1;
  }
  if (!m || strcmp(m, "test value") != 0) {
    std::cout << "Problem setting M. Value of M: " << m << std::endl;
    res = 1;
  }
  if (p != "1") {
    std::cout << "Problem setting P. Value of P: " << p << std::endl;
    res = 1;
  }
  std::cout << "Value of N: " << n << std::endl;
  std::cout << "Value of M: " << m << std::endl;
  std::cout << "Value of P: " << p << std::endl;
  if (m) {
    delete[] m;
  }

  char** newArgv = 0;
  int newArgc = 0;
  arg.GetUnusedArguments(&newArgc, &newArgv);
  int cc;
  const char* valid_unused_args[9] = { 0,
                                       "--ignored",
                                       "--second-ignored",
                                       "third-ignored",
                                       "some",
                                       "junk",
                                       "at",
                                       "the",
                                       "end" };
  if (newArgc != 9) {
    std::cerr << "Bad number of unused arguments: " << newArgc << std::endl;
    res = 1;
  }
  for (cc = 0; cc < newArgc; ++cc) {
    assert(newArgv[cc]); /* Quiet Clang scan-build. */
    std::cout << "Unused argument[" << cc << "] = [" << newArgv[cc] << "]"
              << std::endl;
    if (cc >= 9) {
      std::cerr << "Too many unused arguments: " << cc << std::endl;
      res = 1;
    } else if (valid_unused_args[cc] &&
               strcmp(valid_unused_args[cc], newArgv[cc]) != 0) {
      std::cerr << "Bad unused argument [" << cc << "] \"" << newArgv[cc]
                << "\" should be: \"" << valid_unused_args[cc] << "\""
                << std::endl;
      res = 1;
    }
  }
  arg.DeleteRemainingArguments(newArgc, &newArgv);

  return res;
}